

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTipStates
          (BeagleCPUImpl<float,_1,_0> *this,int tipIndex,int *inStates)

{
  int **ppiVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = -5;
  if ((-1 < tipIndex) && (tipIndex < this->kTipCount)) {
    piVar2 = (int *)mallocAligned(this,(long)this->kPaddedPatternCount << 2);
    this->gTipStates[(uint)tipIndex] = piVar2;
    ppiVar1 = this->gTipStates;
    for (lVar3 = 0; lVar4 = (long)this->kPatternCount, lVar3 < lVar4; lVar3 = lVar3 + 1) {
      iVar5 = this->kStateCount;
      if (inStates[lVar3] < this->kStateCount) {
        iVar5 = inStates[lVar3];
      }
      ppiVar1[(uint)tipIndex][lVar3] = iVar5;
    }
    ppiVar1 = this->gTipStates;
    for (; lVar4 < this->kPaddedPatternCount; lVar4 = lVar4 + 1) {
      ppiVar1[(uint)tipIndex][lVar4] = this->kStateCount;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipStates(int tipIndex,
                                const int* inStates) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    gTipStates[tipIndex] = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);
    // TODO: What if this throws a memory full error?
    for (int j = 0; j < kPatternCount; j++) {
        gTipStates[tipIndex][j] = (inStates[j] < kStateCount ? inStates[j] : kStateCount);
    }
    for (int j = kPatternCount; j < kPaddedPatternCount; j++) {
        gTipStates[tipIndex][j] = kStateCount;
    }

    return BEAGLE_SUCCESS;
}